

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void initoptions(void)

{
  char *pcVar1;
  long lVar2;
  
  iflags.travelcc.x = -1;
  iflags.travelcc.y = -1;
  flags.warntype = 0;
  flags.inv_order[0x10] = '\0';
  flags.inv_order[0x11] = '\0';
  builtin_strncpy(flags.inv_order,"\f\x05\x02\x03\a\t\n\b\x04\v\x06\r\x0e\x0f\x10",0x10);
  fruitadd("slime mold");
  strncpy(pl_fruit,"slime mold",0x20);
  lVar2 = 0;
  while( true ) {
    pcVar1 = *(char **)((long)&birth_options->name + lVar2);
    if (pcVar1 == (char *)0x0) break;
    nh_set_option(pcVar1,*(nh_optvalue *)((long)&birth_options->value + lVar2),'\0');
    lVar2 = lVar2 + 0x30;
  }
  lVar2 = 0;
  while( true ) {
    pcVar1 = *(char **)((long)&options->name + lVar2);
    if (pcVar1 == (char *)0x0) break;
    nh_set_option(pcVar1,*(nh_optvalue *)((long)&options->value + lVar2),'\0');
    lVar2 = lVar2 + 0x30;
  }
  if (active_birth_options == (nh_option_desc *)0x0) {
    active_birth_options = clone_optlist(birth_options);
  }
  else {
    for (lVar2 = 0; pcVar1 = *(char **)((long)&active_birth_options->name + lVar2),
        pcVar1 != (char *)0x0; lVar2 = lVar2 + 0x30) {
      nh_set_option(pcVar1,*(nh_optvalue *)((long)&active_birth_options->value + lVar2),'\0');
    }
  }
  return;
}

Assistant:

void initoptions(void)
{
	int i;
	
	iflags.travelcc.x = iflags.travelcc.y = -1;
	flags.warntype = 0L;

	/* init flags.inv_order this way, as setting it via the option
	 * requires a preexisting order */
	memcpy(flags.inv_order, def_inv_order, sizeof flags.inv_order);

	fruitadd(obj_descr[SLIME_MOLD].oc_name);
	strncpy(pl_fruit, obj_descr[SLIME_MOLD].oc_name, PL_FSIZ);

	/* init from option definitions */
	for (i = 0; birth_options[i].name; i++)
	    nh_set_option(birth_options[i].name, birth_options[i].value, FALSE);

	for (i = 0; options[i].name; i++)
	    nh_set_option(options[i].name, options[i].value, FALSE);

	if (!active_birth_options) {
	    /* at this point the user may no longer change their birth options.
	     * active_birth_options will recieve birth option changes made during
	     * log replay, so that we can show the user what birth options the
	     * loaded game was started with */
	    active_birth_options = clone_optlist(birth_options);
	} else {
	    /* the switch to alternate birth options has already happened,
	     * so make sure those settings are active instead. */
	    for (i = 0; active_birth_options[i].name; i++) {
		nh_set_option(active_birth_options[i].name,
			      active_birth_options[i].value, FALSE);
	    }
	}
}